

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXConverter.cpp
# Opt level: O1

uint __thiscall
Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial
          (FBXConverter *this,MeshGeometry *mesh,Model *model,aiMatrix4x4 *absolute_transform,
          aiNode *parent,aiNode *root_node)

{
  float fVar1;
  float fVar2;
  pointer paVar3;
  pointer puVar4;
  uint *puVar5;
  pointer paVar6;
  pointer paVar7;
  pointer paVar8;
  value_type_conflict4 *pvVar9;
  pointer ppBVar10;
  pointer ppBVar11;
  pointer ppSVar12;
  ShapeGeometry *this_00;
  pointer ppaVar13;
  pointer ppaVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  pointer ppaVar20;
  pointer ppaVar21;
  aiAnimMesh *paVar22;
  uint uVar23;
  uint uVar24;
  aiVector2D *v;
  MatIndexArray *pMVar25;
  aiMesh *out;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar26;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *pvVar27;
  aiVector3D *paVar28;
  ulong *puVar29;
  aiFace *paVar30;
  uint *puVar31;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar32;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *pvVar33;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *this_01;
  vector<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_> *pvVar34;
  pointer paVar35;
  vector<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_> *pvVar36;
  aiColor4D *__s;
  Skin *pSVar37;
  vector<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_> *pvVar38
  ;
  pointer puVar39;
  uint *puVar40;
  pointer ppBVar41;
  pointer ppBVar42;
  aiAnimMesh **ppaVar43;
  ulong uVar44;
  pointer paVar45;
  size_t sVar46;
  Model *model_00;
  ulong uVar47;
  uint i;
  long lVar48;
  size_t __n;
  aiMesh *paVar49;
  int iVar50;
  aiFace *f;
  aiFace *paVar51;
  long lVar52;
  ulong uVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  float fVar58;
  aiAnimMesh *animMesh;
  BlendShapeChannel *local_e8;
  Model *local_e0;
  aiMatrix4x4 *local_d8;
  aiNode *local_d0;
  vector<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_> animMeshes;
  vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> tempBinormals;
  
  local_e0 = model;
  local_d8 = absolute_transform;
  pMVar25 = MeshGeometry::GetMaterialIndices(mesh);
  local_d0 = parent;
  out = SetupEmptyMesh(this,&mesh->super_Geometry,parent);
  pvVar26 = MeshGeometry::GetVertices(mesh);
  pvVar27 = MeshGeometry::GetFaceIndexCounts(mesh);
  out->mNumVertices =
       (int)((ulong)((long)(pvVar26->
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           )._M_impl.super__Vector_impl_data._M_finish -
                    (long)(pvVar26->
                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                          )._M_impl.super__Vector_impl_data._M_start) >> 2) * -0x55555555;
  paVar45 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  paVar3 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = ((long)paVar3 - (long)paVar45 >> 2) * -0x5555555555555555;
  uVar53 = 0xffffffffffffffff;
  if (SUB168(auVar15 * ZEXT816(0xc),8) == 0) {
    uVar53 = SUB168(auVar15 * ZEXT816(0xc),0);
  }
  paVar28 = (aiVector3D *)operator_new__(uVar53);
  lVar52 = (long)paVar3 - (long)paVar45;
  if (lVar52 != 0) {
    memset(paVar28,0,((lVar52 - 0xcU) / 0xc) * 0xc + 0xc);
  }
  out->mVertices = paVar28;
  paVar45 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_start;
  sVar46 = (long)(pvVar26->
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl
                 .super__Vector_impl_data._M_finish - (long)paVar45;
  if (sVar46 != 0) {
    memmove(paVar28,paVar45,sVar46);
  }
  out->mNumFaces =
       (uint)((ulong)((long)(pvVar27->
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                     (long)(pvVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                           )._M_impl.super__Vector_impl_data._M_start) >> 2);
  puVar39 = (pvVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  puVar4 = (pvVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_start;
  lVar52 = (long)puVar39 - (long)puVar4;
  uVar53 = lVar52 >> 2;
  puVar29 = (ulong *)operator_new__(-(ulong)(uVar53 >> 0x3c != 0) | lVar52 * 4 + 8U);
  paVar51 = (aiFace *)(puVar29 + 1);
  *puVar29 = uVar53;
  if (puVar39 != puVar4) {
    paVar30 = paVar51;
    do {
      paVar30->mNumIndices = 0;
      paVar30->mIndices = (uint *)0x0;
      paVar30 = paVar30 + 1;
    } while (paVar30 != paVar51 + uVar53);
  }
  out->mFaces = paVar51;
  puVar40 = (pvVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
            super__Vector_impl_data._M_start;
  puVar5 = (pvVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar40 != puVar5) {
    iVar50 = 0;
    do {
      uVar24 = *puVar40;
      uVar53 = (ulong)uVar24;
      paVar51->mNumIndices = uVar24;
      puVar31 = (uint *)operator_new__(uVar53 * 4);
      paVar51->mIndices = puVar31;
      uVar23 = 8;
      if (uVar24 - 1 < 3) {
        uVar23 = *(uint *)(&DAT_0070c750 + (ulong)(uVar24 - 1) * 4);
      }
      out->mPrimitiveTypes = uVar23 | out->mPrimitiveTypes;
      if (uVar53 != 0) {
        uVar44 = 0;
        do {
          paVar51->mIndices[uVar44] = iVar50 + (int)uVar44;
          uVar44 = uVar44 + 1;
        } while (uVar53 != uVar44);
        iVar50 = iVar50 + (int)uVar44;
      }
      paVar51 = paVar51 + 1;
      puVar40 = puVar40 + 1;
    } while (puVar40 != puVar5);
  }
  pvVar32 = MeshGeometry::GetNormals(mesh);
  paVar45 = (pvVar32->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  paVar3 = (pvVar32->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  if (paVar45 != paVar3) {
    paVar6 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    paVar7 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    lVar52 = (long)paVar7 - (long)paVar6;
    if ((long)paVar45 - (long)paVar3 != lVar52) goto LAB_005f430e;
    auVar16._8_8_ = 0;
    auVar16._0_8_ = (lVar52 >> 2) * -0x5555555555555555;
    uVar53 = 0xffffffffffffffff;
    if (SUB168(auVar16 * ZEXT816(0xc),8) == 0) {
      uVar53 = SUB168(auVar16 * ZEXT816(0xc),0);
    }
    paVar28 = (aiVector3D *)operator_new__(uVar53);
    lVar52 = (long)paVar7 - (long)paVar6;
    if (lVar52 != 0) {
      memset(paVar28,0,((lVar52 - 0xcU) / 0xc) * 0xc + 0xc);
    }
    out->mNormals = paVar28;
    paVar45 = (pvVar32->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    sVar46 = (long)(pvVar32->
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_finish - (long)paVar45;
    if (sVar46 != 0) {
      memmove(paVar28,paVar45,sVar46);
    }
  }
  pvVar33 = MeshGeometry::GetTangents(mesh);
  this_01 = MeshGeometry::GetBinormals(mesh);
  if ((pvVar33->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (pvVar33->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
    .super__Vector_impl_data._M_start = (pointer)0x0;
    tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
    .super__Vector_impl_data._M_finish = (pointer)0x0;
    tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl
    .super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((this_01->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish ==
        (this_01->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_start) {
      lVar52 = (long)(pvVar32->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)(pvVar32->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
      if (lVar52 == 0) {
        this_01 = (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0;
      }
      else {
        this_01 = &tempBinormals;
        std::vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>::resize
                  (this_01,(lVar52 >> 2) * -0x5555555555555555);
        paVar45 = (pvVar33->
                  super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        if ((pvVar33->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
            _M_impl.super__Vector_impl_data._M_finish != paVar45) {
          uVar24 = 1;
          uVar53 = 0;
          do {
            paVar3 = (pvVar32->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_start;
            fVar55 = paVar3[uVar53].x;
            fVar1 = paVar3[uVar53].y;
            fVar2 = paVar45[uVar53].z;
            fVar56 = paVar3[uVar53].z;
            fVar57 = paVar45[uVar53].x;
            fVar58 = paVar45[uVar53].y;
            tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar53].x = fVar1 * fVar2 - fVar58 * fVar56;
            tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar53].y = fVar56 * fVar57 - fVar2 * fVar55;
            tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
            ._M_impl.super__Vector_impl_data._M_start[uVar53].z = fVar55 * fVar58 - fVar57 * fVar1;
            uVar53 = (ulong)uVar24;
            paVar45 = (pvVar33->
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            uVar44 = ((long)(pvVar33->
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)paVar45 >> 2) *
                     -0x5555555555555555;
            uVar24 = uVar24 + 1;
          } while (uVar53 <= uVar44 && uVar44 - uVar53 != 0);
        }
      }
    }
    if (this_01 != (vector<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_> *)0x0) {
      paVar45 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      paVar3 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
      lVar52 = (long)paVar3 - (long)paVar45;
      if ((long)(pvVar33->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(pvVar33->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start != lVar52) {
        __assert_fail("tangents.size() == vertices.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0x480,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode *, aiNode *)"
                     );
      }
      if ((long)(this_01->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(this_01->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start != lVar52) {
        __assert_fail("binormals->size() == vertices.size()",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                      ,0x481,
                      "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode *, aiNode *)"
                     );
      }
      auVar17._8_8_ = 0;
      auVar17._0_8_ = (lVar52 >> 2) * -0x5555555555555555;
      uVar53 = 0xffffffffffffffff;
      if (SUB168(auVar17 * ZEXT816(0xc),8) == 0) {
        uVar53 = SUB168(auVar17 * ZEXT816(0xc),0);
      }
      paVar28 = (aiVector3D *)operator_new__(uVar53);
      lVar52 = (long)paVar3 - (long)paVar45;
      if (lVar52 != 0) {
        memset(paVar28,0,((lVar52 - 0xcU) / 0xc) * 0xc + 0xc);
      }
      out->mTangents = paVar28;
      paVar45 = (pvVar33->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      sVar46 = (long)(pvVar33->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar45;
      if (sVar46 != 0) {
        memmove(paVar28,paVar45,sVar46);
      }
      paVar45 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      paVar3 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>)
               ._M_impl.super__Vector_impl_data._M_finish;
      auVar18._8_8_ = 0;
      auVar18._0_8_ = ((long)paVar3 - (long)paVar45 >> 2) * -0x5555555555555555;
      uVar53 = 0xffffffffffffffff;
      if (SUB168(auVar18 * ZEXT816(0xc),8) == 0) {
        uVar53 = SUB168(auVar18 * ZEXT816(0xc),0);
      }
      paVar28 = (aiVector3D *)operator_new__(uVar53);
      lVar52 = (long)paVar3 - (long)paVar45;
      if (lVar52 != 0) {
        memset(paVar28,0,((lVar52 - 0xcU) / 0xc) * 0xc + 0xc);
      }
      out->mBitangents = paVar28;
      paVar45 = (this_01->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      sVar46 = (long)(this_01->
                     super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                     _M_impl.super__Vector_impl_data._M_finish - (long)paVar45;
      if (sVar46 != 0) {
        memmove(paVar28,paVar45,sVar46);
      }
    }
    if (tempBinormals.super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(tempBinormals.
                      super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)tempBinormals.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)tempBinormals.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
  }
  lVar52 = 0;
  do {
    pvVar34 = MeshGeometry::GetTextureCoords(mesh,(uint)lVar52);
    if ((pvVar34->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_start ==
        (pvVar34->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
        _M_impl.super__Vector_impl_data._M_finish) break;
    paVar45 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    paVar3 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    auVar19._8_8_ = 0;
    auVar19._0_8_ = ((long)paVar3 - (long)paVar45 >> 2) * -0x5555555555555555;
    uVar53 = SUB168(auVar19 * ZEXT816(0xc),0);
    if (SUB168(auVar19 * ZEXT816(0xc),8) != 0) {
      uVar53 = 0xffffffffffffffff;
    }
    paVar28 = (aiVector3D *)operator_new__(uVar53);
    lVar48 = (long)paVar3 - (long)paVar45;
    if (lVar48 != 0) {
      memset(paVar28,0,((lVar48 - 0xcU) / 0xc) * 0xc + 0xc);
    }
    out->mTextureCoords[lVar52] = paVar28;
    paVar8 = (pvVar34->super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_finish;
    for (paVar35 = (pvVar34->
                   super__Vector_base<aiVector2t<float>,_std::allocator<aiVector2t<float>_>_>).
                   _M_impl.super__Vector_impl_data._M_start; paVar35 != paVar8;
        paVar35 = paVar35 + 1) {
      fVar55 = paVar35->y;
      paVar28->x = paVar35->x;
      paVar28->y = fVar55;
      paVar28->z = 0.0;
      paVar28 = paVar28 + 1;
    }
    out->mNumUVComponents[lVar52] = 2;
    lVar52 = lVar52 + 1;
  } while (lVar52 != 8);
  uVar53 = 0;
  do {
    paVar49 = (aiMesh *)(uVar53 & 0xffffffff);
    pvVar36 = MeshGeometry::GetVertexColors(mesh,(uint)uVar53);
    if ((pvVar36->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        super__Vector_impl_data._M_start ==
        (pvVar36->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl.
        super__Vector_impl_data._M_finish) break;
    paVar45 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_finish;
    paVar3 = (pvVar26->super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
             _M_impl.super__Vector_impl_data._M_start;
    lVar52 = (long)paVar45 - (long)paVar3 >> 2;
    __n = lVar52 * -0x5555555555555550;
    sVar46 = __n;
    if (0xfffffffffffffff < (ulong)(lVar52 * -0x5555555555555555)) {
      sVar46 = 0xffffffffffffffff;
    }
    __s = (aiColor4D *)operator_new__(sVar46);
    if (paVar45 != paVar3) {
      memset(__s,0,__n);
    }
    out->mColors[uVar53] = __s;
    paVar49 = (aiMesh *)
              (pvVar36->super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>).
              _M_impl.super__Vector_impl_data._M_start;
    sVar46 = (long)(pvVar36->
                   super__Vector_base<aiColor4t<float>,_std::allocator<aiColor4t<float>_>_>)._M_impl
                   .super__Vector_impl_data._M_finish - (long)paVar49;
    if (sVar46 != 0) {
      memmove(__s,paVar49,sVar46);
    }
    uVar53 = uVar53 + 1;
  } while (uVar53 != 8);
  if ((this->doc->settings->readMaterials == true) &&
     (pvVar9 = (pMVar25->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start,
     pvVar9 != (pMVar25->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_finish)) {
    paVar49 = out;
    ConvertMaterialForMesh(this,out,local_e0,mesh,*pvVar9);
  }
  else {
    LogFunctions<Assimp::FBXImporter>::LogError((char *)0x5f3c73);
    uVar24 = GetDefaultMaterial(this);
    out->mMaterialIndex = uVar24;
  }
  if ((this->doc->settings->readWeights == true) &&
     (pSVar37 = Geometry::DeformerSkin(&mesh->super_Geometry), pSVar37 != (Skin *)0x0)) {
    paVar49 = out;
    ConvertWeights(this,out,model_00,mesh,local_d8,local_d0,root_node,0xffffffff,
                   (vector<unsigned_int,_std::allocator<unsigned_int>_> *)0x0);
  }
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pvVar38 = Geometry::GetBlendShapes(&mesh->super_Geometry);
  ppBVar10 = (pvVar38->
             super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  ppaVar20 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppaVar21 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  for (ppBVar42 = (pvVar38->
                  super__Vector_base<const_Assimp::FBX::BlendShape_*,_std::allocator<const_Assimp::FBX::BlendShape_*>_>
                  )._M_impl.super__Vector_impl_data._M_start;
      animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start = ppaVar20,
      animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
      super__Vector_impl_data._M_finish = ppaVar21, ppBVar42 != ppBVar10; ppBVar42 = ppBVar42 + 1) {
    ppBVar11 = ((*ppBVar42)->blendShapeChannels).
               super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    for (ppBVar41 = ((*ppBVar42)->blendShapeChannels).
                    super__Vector_base<const_Assimp::FBX::BlendShapeChannel_*,_std::allocator<const_Assimp::FBX::BlendShapeChannel_*>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppBVar41 != ppBVar11;
        ppBVar41 = ppBVar41 + 1) {
      local_e8 = *ppBVar41;
      if ((local_e8->shapeGeometries).
          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (local_e8->shapeGeometries).
          super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        uVar53 = 0;
        do {
          animMesh = aiCreateAnimMesh(out);
          ppSVar12 = (local_e8->shapeGeometries).
                     super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                     ._M_impl.super__Vector_impl_data._M_start;
          uVar44 = uVar53;
          if ((ulong)((long)(local_e8->shapeGeometries).
                            super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish - (long)ppSVar12 >> 3) <=
              uVar53) {
LAB_005f42ef:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar44);
            goto LAB_005f4300;
          }
          this_00 = ppSVar12[uVar53];
          pvVar26 = ShapeGeometry::GetVertices(this_00);
          pvVar32 = ShapeGeometry::GetNormals(this_00);
          pvVar27 = ShapeGeometry::GetIndices(this_00);
          paVar22 = animMesh;
          FixAnimMeshName((string *)&tempBinormals,(FBXConverter *)paVar49,
                          &(this_00->super_Geometry).super_Object.name);
          paVar45 = tempBinormals.
                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_finish < (pointer)0x400) {
            (paVar22->mName).length =
                 (ai_uint32)
                 tempBinormals.
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            memcpy((paVar22->mName).data,
                   tempBinormals.
                   super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                   _M_impl.super__Vector_impl_data._M_start,
                   (size_t)tempBinormals.
                           super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish);
            (paVar22->mName).data[(long)paVar45] = '\0';
          }
          if (tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start !=
              (pointer)&tempBinormals.
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage) {
            operator_delete(tempBinormals.
                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                            ._M_impl.super__Vector_impl_data._M_start,
                            (ulong)((long)&(tempBinormals.
                                            super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                            ._M_impl.super__Vector_impl_data._M_end_of_storage)->x +
                                   1));
          }
          puVar39 = (pvVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl.super__Vector_impl_data._M_start;
          if ((pvVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
              super__Vector_impl_data._M_finish != puVar39) {
            uVar44 = 0;
            do {
              paVar45 = (pvVar26->
                        super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                        _M_impl.super__Vector_impl_data._M_start;
              uVar47 = ((long)(pvVar26->
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)paVar45 >> 2) *
                       -0x5555555555555555;
              if (uVar47 < uVar44 || uVar47 - uVar44 == 0) {
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar44);
LAB_005f42de:
                std::__throw_out_of_range_fmt
                          ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                           ,uVar44);
                goto LAB_005f42ef;
              }
              paVar3 = (pvVar32->
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>).
                       _M_impl.super__Vector_impl_data._M_start;
              uVar47 = ((long)(pvVar32->
                              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                              )._M_impl.super__Vector_impl_data._M_finish - (long)paVar3 >> 2) *
                       -0x5555555555555555;
              if (uVar47 < uVar44 || uVar47 - uVar44 == 0) goto LAB_005f42de;
              local_d0 = (aiNode *)CONCAT44(local_d0._4_4_,paVar45[uVar44].x);
              local_d8 = (aiMatrix4x4 *)CONCAT44(local_d8._4_4_,paVar45[uVar44].y);
              local_e0 = (Model *)CONCAT44(local_e0._4_4_,paVar45[uVar44].z);
              fVar55 = paVar3[uVar44].x;
              fVar1 = paVar3[uVar44].y;
              fVar2 = paVar3[uVar44].z;
              tempBinormals.
              super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
              super__Vector_impl_data._M_start =
                   (pointer)((ulong)tempBinormals.
                                    super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start & 0xffffffff00000000);
              puVar40 = MeshGeometry::ToOutputVertexIndex
                                  (mesh,puVar39[uVar44],(uint *)&tempBinormals);
              if ((int)tempBinormals.
                       super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>.
                       _M_impl.super__Vector_impl_data._M_start != 0) {
                uVar47 = 0;
                fVar56 = local_d0._0_4_;
                fVar57 = local_d8._0_4_;
                fVar58 = local_e0._0_4_;
                do {
                  uVar24 = puVar40[uVar47];
                  paVar28 = animMesh->mVertices;
                  paVar28[uVar24].x = paVar28[uVar24].x + fVar56;
                  paVar28[uVar24].y = paVar28[uVar24].y + fVar57;
                  paVar28[uVar24].z = paVar28[uVar24].z + fVar58;
                  paVar28 = animMesh->mNormals;
                  if (paVar28 != (aiVector3D *)0x0) {
                    paVar28[uVar24].x = paVar28[uVar24].x + fVar55;
                    paVar28[uVar24].y = paVar28[uVar24].y + fVar1;
                    paVar28[uVar24].z = paVar28[uVar24].z + fVar2;
                    paVar28 = animMesh->mNormals;
                    fVar54 = paVar28[uVar24].z * paVar28[uVar24].z +
                             paVar28[uVar24].x * paVar28[uVar24].x +
                             paVar28[uVar24].y * paVar28[uVar24].y;
                    if (fVar54 < 0.0) {
                      fVar54 = sqrtf(fVar54);
                      fVar56 = local_d0._0_4_;
                      fVar57 = local_d8._0_4_;
                      fVar58 = local_e0._0_4_;
                    }
                    else {
                      fVar54 = SQRT(fVar54);
                    }
                    if (0.0 < fVar54) {
                      paVar28 = paVar28 + uVar24;
                      fVar54 = 1.0 / fVar54;
                      paVar28->x = paVar28->x * fVar54;
                      paVar28->y = paVar28->y * fVar54;
                      paVar28->z = fVar54 * paVar28->z;
                    }
                  }
                  uVar47 = uVar47 + 1;
                } while (uVar47 < ((ulong)tempBinormals.
                                          super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start & 0xffffffff));
              }
              uVar44 = uVar44 + 1;
              puVar39 = (pvVar27->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_start;
            } while (uVar44 < (ulong)((long)(pvVar27->
                                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                            )._M_impl.super__Vector_impl_data._M_finish -
                                      (long)puVar39 >> 2));
          }
          fVar55 = 1.0;
          if (8 < (ulong)((long)(local_e8->shapeGeometries).
                                super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                         (long)(local_e8->shapeGeometries).
                               super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                               ._M_impl.super__Vector_impl_data._M_start)) {
            fVar55 = local_e8->percent / 100.0;
          }
          animMesh->mWeight = fVar55;
          paVar49 = (aiMesh *)
                    animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
          if (animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<aiAnimMesh*,std::allocator<aiAnimMesh*>>::
            _M_realloc_insert<aiAnimMesh*const&>
                      ((vector<aiAnimMesh*,std::allocator<aiAnimMesh*>> *)&animMeshes,
                       (iterator)
                       animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                       _M_impl.super__Vector_impl_data._M_finish,&animMesh);
          }
          else {
            *animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish = animMesh;
            animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
          uVar53 = uVar53 + 1;
        } while (uVar53 < (ulong)((long)(local_e8->shapeGeometries).
                                        super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                        ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(local_e8->shapeGeometries).
                                        super__Vector_base<const_Assimp::FBX::ShapeGeometry_*,_std::allocator<const_Assimp::FBX::ShapeGeometry_*>_>
                                        ._M_impl.super__Vector_impl_data._M_start >> 3));
      }
    }
    ppaVar20 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppaVar21 = animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
               super__Vector_impl_data._M_finish;
  }
  if ((long)ppaVar21 - (long)ppaVar20 != 0) {
    uVar53 = (long)ppaVar21 - (long)ppaVar20 >> 3;
    out->mNumAnimMeshes = (uint)uVar53;
    ppaVar43 = (aiAnimMesh **)
               operator_new__(-(ulong)(uVar53 >> 0x3d != 0) | (long)ppaVar21 - (long)ppaVar20);
    out->mAnimMeshes = ppaVar43;
    if (ppaVar21 != ppaVar20) {
      uVar44 = 0;
      do {
        if ((ulong)((long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar44)
        goto LAB_005f4300;
        out->mAnimMeshes[uVar44] =
             animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start[uVar44];
        uVar44 = uVar44 + 1;
      } while (uVar53 + (uVar53 == 0) != uVar44);
    }
  }
  ppaVar13 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_start;
  ppaVar14 = (this->meshes).super__Vector_base<aiMesh_*,_std::allocator<aiMesh_*>_>._M_impl.
             super__Vector_impl_data._M_finish;
  if (animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)animMeshes.super__Vector_base<aiAnimMesh_*,_std::allocator<aiAnimMesh_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)((ulong)((long)ppaVar14 - (long)ppaVar13) >> 3) - 1;
LAB_005f4300:
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_005f430e:
  __assert_fail("normals.size() == vertices.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXConverter.cpp"
                ,0x463,
                "unsigned int Assimp::FBX::FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &, const Model &, const aiMatrix4x4 &, aiNode *, aiNode *)"
               );
}

Assistant:

unsigned int FBXConverter::ConvertMeshSingleMaterial(const MeshGeometry &mesh, const Model &model,
                                                             const aiMatrix4x4 &absolute_transform, aiNode *parent,
                                                             aiNode *root_node)
        {
            const MatIndexArray& mindices = mesh.GetMaterialIndices();
            aiMesh* const out_mesh = SetupEmptyMesh(mesh, parent);

            const std::vector<aiVector3D>& vertices = mesh.GetVertices();
            const std::vector<unsigned int>& faces = mesh.GetFaceIndexCounts();

            // copy vertices
            out_mesh->mNumVertices = static_cast<unsigned int>(vertices.size());
            out_mesh->mVertices = new aiVector3D[vertices.size()];

            std::copy(vertices.begin(), vertices.end(), out_mesh->mVertices);

            // generate dummy faces
            out_mesh->mNumFaces = static_cast<unsigned int>(faces.size());
            aiFace* fac = out_mesh->mFaces = new aiFace[faces.size()]();

            unsigned int cursor = 0;
            for (unsigned int pcount : faces) {
                aiFace& f = *fac++;
                f.mNumIndices = pcount;
                f.mIndices = new unsigned int[pcount];
                switch (pcount)
                {
                case 1:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POINT;
                    break;
                case 2:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_LINE;
                    break;
                case 3:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_TRIANGLE;
                    break;
                default:
                    out_mesh->mPrimitiveTypes |= aiPrimitiveType_POLYGON;
                    break;
                }
                for (unsigned int i = 0; i < pcount; ++i) {
                    f.mIndices[i] = cursor++;
                }
            }

            // copy normals
            const std::vector<aiVector3D>& normals = mesh.GetNormals();
            if (normals.size()) {
                ai_assert(normals.size() == vertices.size());

                out_mesh->mNormals = new aiVector3D[vertices.size()];
                std::copy(normals.begin(), normals.end(), out_mesh->mNormals);
            }

            // copy tangents - assimp requires both tangents and bitangents (binormals)
            // to be present, or neither of them. Compute binormals from normals
            // and tangents if needed.
            const std::vector<aiVector3D>& tangents = mesh.GetTangents();
            const std::vector<aiVector3D>* binormals = &mesh.GetBinormals();

            if (tangents.size()) {
                std::vector<aiVector3D> tempBinormals;
                if (!binormals->size()) {
                    if (normals.size()) {
                        tempBinormals.resize(normals.size());
                        for (unsigned int i = 0; i < tangents.size(); ++i) {
                            tempBinormals[i] = normals[i] ^ tangents[i];
                        }

                        binormals = &tempBinormals;
                    }
                    else {
                        binormals = nullptr;
                    }
                }

                if (binormals) {
                    ai_assert(tangents.size() == vertices.size());
                    ai_assert(binormals->size() == vertices.size());

                    out_mesh->mTangents = new aiVector3D[vertices.size()];
                    std::copy(tangents.begin(), tangents.end(), out_mesh->mTangents);

                    out_mesh->mBitangents = new aiVector3D[vertices.size()];
                    std::copy(binormals->begin(), binormals->end(), out_mesh->mBitangents);
                }
            }

            // copy texture coords
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_TEXTURECOORDS; ++i) {
                const std::vector<aiVector2D>& uvs = mesh.GetTextureCoords(i);
                if (uvs.empty()) {
                    break;
                }

                aiVector3D* out_uv = out_mesh->mTextureCoords[i] = new aiVector3D[vertices.size()];
                for (const aiVector2D& v : uvs) {
                    *out_uv++ = aiVector3D(v.x, v.y, 0.0f);
                }

                out_mesh->mNumUVComponents[i] = 2;
            }

            // copy vertex colors
            for (unsigned int i = 0; i < AI_MAX_NUMBER_OF_COLOR_SETS; ++i) {
                const std::vector<aiColor4D>& colors = mesh.GetVertexColors(i);
                if (colors.empty()) {
                    break;
                }

                out_mesh->mColors[i] = new aiColor4D[vertices.size()];
                std::copy(colors.begin(), colors.end(), out_mesh->mColors[i]);
            }

            if (!doc.Settings().readMaterials || mindices.empty()) {
                FBXImporter::LogError("no material assigned to mesh, setting default material");
                out_mesh->mMaterialIndex = GetDefaultMaterial();
            }
            else {
                ConvertMaterialForMesh(out_mesh, model, mesh, mindices[0]);
            }

            if (doc.Settings().readWeights && mesh.DeformerSkin() != nullptr) {
                ConvertWeights(out_mesh, model, mesh, absolute_transform, parent, root_node, NO_MATERIAL_SEPARATION,
                               nullptr);
            }

            std::vector<aiAnimMesh*> animMeshes;
            for (const BlendShape* blendShape : mesh.GetBlendShapes()) {
                for (const BlendShapeChannel* blendShapeChannel : blendShape->BlendShapeChannels()) {
                    const std::vector<const ShapeGeometry*>& shapeGeometries = blendShapeChannel->GetShapeGeometries();
                    for (size_t i = 0; i < shapeGeometries.size(); i++) {
                        aiAnimMesh *animMesh = aiCreateAnimMesh(out_mesh);
                        const ShapeGeometry* shapeGeometry = shapeGeometries.at(i);
                        const std::vector<aiVector3D>& vertices = shapeGeometry->GetVertices();
                        const std::vector<aiVector3D>& normals = shapeGeometry->GetNormals();
                        const std::vector<unsigned int>& indices = shapeGeometry->GetIndices();
                        animMesh->mName.Set(FixAnimMeshName(shapeGeometry->Name()));
                        for (size_t j = 0; j < indices.size(); j++) {
                            unsigned int index = indices.at(j);
                            aiVector3D vertex = vertices.at(j);
                            aiVector3D normal = normals.at(j);
                            unsigned int count = 0;
                            const unsigned int* outIndices = mesh.ToOutputVertexIndex(index, count);
                            for (unsigned int k = 0; k < count; k++) {
                                unsigned int index = outIndices[k];
                                animMesh->mVertices[index] += vertex;
                                if (animMesh->mNormals != nullptr) {
                                    animMesh->mNormals[index] += normal;
                                    animMesh->mNormals[index].NormalizeSafe();
                                }
                            }
                        }
                        animMesh->mWeight = shapeGeometries.size() > 1 ? blendShapeChannel->DeformPercent() / 100.0f : 1.0f;
                        animMeshes.push_back(animMesh);
                    }
                }
            }
            const size_t numAnimMeshes = animMeshes.size();
            if (numAnimMeshes > 0) {
                out_mesh->mNumAnimMeshes = static_cast<unsigned int>(numAnimMeshes);
                out_mesh->mAnimMeshes = new aiAnimMesh*[numAnimMeshes];
                for (size_t i = 0; i < numAnimMeshes; i++) {
                    out_mesh->mAnimMeshes[i] = animMeshes.at(i);
                }
            }
            return static_cast<unsigned int>(meshes.size() - 1);
        }